

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# covscript.cpp
# Opt level: O1

string * cs::process_path(string *__return_storage_ptr__,string *raw)

{
  pointer pcVar1;
  long lVar2;
  long lVar3;
  fatal_error *this;
  string local_38;
  
  lVar2 = std::__cxx11::string::find((char)raw,0x22);
  lVar3 = std::__cxx11::string::rfind((char)raw,0x22);
  if (lVar2 == -1) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar1 = (raw->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar1,pcVar1 + raw->_M_string_length);
  }
  else {
    if (lVar2 == lVar3) {
      this = (fatal_error *)__cxa_allocate_exception(0x28);
      local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_38,"argument syntax error.","");
      fatal_error::fatal_error(this,&local_38);
      __cxa_throw(this,&fatal_error::typeinfo,fatal_error::~fatal_error);
    }
    std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)raw);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string process_path(const std::string &raw)
	{
		auto pos0 = raw.find('\"');
		auto pos1 = raw.rfind('\"');
		if (pos0 != std::string::npos) {
			if (pos0 == pos1)
				throw cs::fatal_error("argument syntax error.");
			else
				return raw.substr(pos0 + 1, pos1 - pos0 - 1);
		}
		else
			return raw;
	}